

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall
Engine_testAddIntegerWithTagsVector_Test::Engine_testAddIntegerWithTagsVector_Test
          (Engine_testAddIntegerWithTagsVector_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0019d540;
  return;
}

Assistant:

TEST(Engine, testAddIntegerWithTagsVector) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    std::vector<Tag> tags;
    tags.reserve(2);
    Tag::appendTag(tags, "Hello", "World");
    Tag::appendTag(tags, "Another", "Tag");
    e.Add("foo", 100000000, tags);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100000000, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Hello", im.tags[0].name);
    ASSERT_EQ("World", im.tags[0].value);
    ASSERT_EQ("Another", im.tags[1].name);
    ASSERT_EQ("Tag", im.tags[1].value);
}